

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O2

FT_Error af_cjk_hints_detect_features(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Segment *ppAVar1;
  long lVar2;
  undefined2 uVar3;
  short sVar4;
  AF_Direction AVar5;
  long lVar6;
  AF_Segment_conflict pAVar7;
  AF_StyleMetrics_conflict pAVar8;
  FT_Memory memory;
  bool bVar9;
  AF_Segment pAVar10;
  FT_Error FVar11;
  AF_Point_conflict pAVar12;
  FT_Long FVar13;
  long lVar14;
  AF_Edge_conflict pAVar15;
  long lVar16;
  AF_Segment_conflict pAVar17;
  AF_Edge_conflict pAVar18;
  int iVar19;
  AF_Segment_conflict pAVar20;
  ulong uVar21;
  AF_Edge_conflict pAVar22;
  AF_AxisHints axis;
  AF_AxisHints axis_00;
  AF_Segment pAVar23;
  AF_Segment_conflict pAVar24;
  byte bVar25;
  ulong uVar26;
  ushort uVar27;
  int iVar28;
  AF_Segment pAVar29;
  ushort uVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  AF_Segment_conflict pAVar35;
  short sVar36;
  uint uVar37;
  AF_Segment pAVar38;
  ulong uVar39;
  AF_Segment_conflict pAVar40;
  AF_Segment_conflict pAVar41;
  AF_Segment_conflict seg;
  AF_Segment_conflict pAVar42;
  int iVar43;
  AF_Edge *ppAVar44;
  AF_Edge_conflict local_58;
  AF_Segment_conflict local_48;
  AF_Edge_conflict local_38;
  
  uVar39 = (ulong)dim;
  axis_00 = hints->axis + uVar39;
  pAVar24 = hints->axis[uVar39].segments;
  if (pAVar24 == (AF_Segment_conflict)0x0) {
    pAVar40 = (AF_Segment_conflict)0x0;
  }
  else {
    pAVar40 = pAVar24 + axis_00->num_segments;
  }
  FVar11 = af_latin_hints_compute_segments(hints,dim);
  if (FVar11 == 0) {
    for (; pAVar24 < pAVar40; pAVar24 = pAVar24 + 1) {
      pAVar12 = pAVar24->first;
      uVar30 = pAVar12->flags & 3;
      bVar25 = pAVar24->flags & 0xfe;
      while (pAVar12 != pAVar24->last) {
        pAVar12 = pAVar12->next;
        uVar27 = pAVar12->flags & 3;
        if (uVar30 == 0 && uVar27 == 0) break;
        uVar30 = uVar27;
        if (pAVar12 == pAVar24->last) {
          bVar25 = pAVar24->flags | 1;
        }
      }
      pAVar24->flags = bVar25;
    }
    pAVar24 = hints->axis[uVar39].segments;
    if (pAVar24 == (AF_Segment_conflict)0x0) {
      pAVar40 = (AF_Segment_conflict)0x0;
    }
    else {
      pAVar40 = pAVar24 + axis_00->num_segments;
    }
    AVar5 = hints->axis[uVar39].major_dir;
    uVar37 = *(uint *)&hints->metrics[1].style_class;
    uVar21 = (ulong)(dim != AF_DIMENSION_HORZ) * 0x10;
    FVar13 = FT_DivFix(0xc0,*(FT_Long *)((long)hints->axis[0].embedded.segments + (uVar21 - 0x68)));
    lVar16 = 0;
    for (pAVar20 = pAVar24; pAVar17 = pAVar24, pAVar20 < pAVar40; pAVar20 = pAVar20 + 1) {
      lVar14 = lVar16;
      if (AVar5 == pAVar20->dir) {
        for (; pAVar17 < pAVar40; pAVar17 = pAVar17 + 1) {
          if (((lVar14 != 0) && (pAVar17->dir + AVar5 == 0)) &&
             (lVar32 = (long)pAVar17->pos - (long)pAVar20->pos, -1 < lVar32)) {
            uVar3 = pAVar20->max_coord;
            sVar36 = pAVar17->min_coord;
            if (pAVar17->min_coord < pAVar20->min_coord) {
              sVar36 = pAVar20->min_coord;
            }
            sVar4 = pAVar17->max_coord;
            if ((short)uVar3 < sVar4) {
              sVar4 = uVar3;
            }
            lVar34 = (long)sVar4 - (long)sVar36;
            if ((long)(ulong)(uVar37 >> 8) <= lVar34) {
              lVar2 = lVar32 * 8;
              lVar6 = pAVar20->score;
              if ((SBORROW8(lVar2,lVar6 * 9) != lVar2 + lVar6 * -9 < 0) &&
                 ((SBORROW8(lVar2,lVar6 * 7) != lVar2 + lVar6 * -7 < 0 || (pAVar20->len < lVar34))))
              {
                pAVar20->score = lVar32;
                pAVar20->len = lVar34;
                pAVar20->link = pAVar17;
              }
              lVar6 = pAVar17->score;
              if ((SBORROW8(lVar2,lVar6 * 9) != lVar2 + lVar6 * -9 < 0) &&
                 ((SBORROW8(lVar2,lVar6 * 7) != lVar2 + lVar6 * -7 < 0 || (pAVar17->len < lVar34))))
              {
                pAVar17->score = lVar32;
                pAVar17->len = lVar34;
                pAVar17->link = pAVar20;
              }
            }
          }
          lVar14 = lVar14 + -0x50;
        }
      }
      lVar16 = lVar16 + 0x50;
    }
    for (; pAVar17 < pAVar40; pAVar17 = pAVar17 + 1) {
      pAVar20 = pAVar17->link;
      if ((pAVar20 != (AF_Segment_conflict)0x0) && (pAVar20->link == pAVar17)) {
        sVar36 = pAVar20->pos;
        sVar4 = pAVar17->pos;
        if ((sVar4 < sVar36) && (lVar16 = pAVar17->score, lVar16 < FVar13)) {
          for (pAVar35 = pAVar24; pAVar35 < pAVar40; pAVar35 = pAVar35 + 1) {
            if (((((pAVar17 != pAVar35 && pAVar35->pos <= sVar4) &&
                  (pAVar7 = pAVar35->link, pAVar7 != (AF_Segment_conflict)0x0)) &&
                 (pAVar7->link == pAVar35)) && (sVar36 <= pAVar7->pos)) &&
               (((sVar4 != pAVar35->pos || (sVar36 != pAVar7->pos)) &&
                ((lVar14 = pAVar35->score, lVar16 < lVar14 &&
                 (lVar16 * 4 - lVar14 != 0 && lVar14 <= lVar16 * 4)))))) {
              pAVar42 = pAVar24;
              if (SBORROW8(pAVar17->len,pAVar35->len * 3) != pAVar17->len + pAVar35->len * -3 < 0) {
                pAVar20->link = (AF_Segment)0x0;
                pAVar17->link = (AF_Segment)0x0;
                break;
              }
              for (; pAVar42 < pAVar40; pAVar42 = pAVar42 + 1) {
                pAVar41 = pAVar20;
                if ((pAVar42->link == pAVar35) || (pAVar41 = pAVar17, pAVar42->link == pAVar7)) {
                  pAVar42->link = (AF_Segment)0x0;
                  pAVar42->serif = pAVar41;
                }
              }
            }
          }
        }
      }
    }
    for (; pAVar24 < pAVar40; pAVar24 = pAVar24 + 1) {
      pAVar38 = pAVar24->link;
      if ((pAVar38 != (AF_Segment)0x0) && (pAVar24 != pAVar38->link)) {
        pAVar24->link = (AF_Segment)0x0;
        if ((pAVar38->score < FVar13) || (pAVar24->score < pAVar38->score * 4)) {
          pAVar24->serif = pAVar38->link;
        }
      }
    }
    pAVar8 = hints->metrics;
    pAVar24 = hints->axis[uVar39].segments;
    if (pAVar24 == (AF_Segment_conflict)0x0) {
      local_48 = (AF_Segment_conflict)0x0;
    }
    else {
      local_48 = pAVar24 + axis_00->num_segments;
    }
    memory = hints->memory;
    hints->axis[uVar39].num_edges = 0;
    FVar13 = *(FT_Long *)((long)hints->axis[0].embedded.segments + ((uVar21 | 8) - 0x70));
    lVar16 = *(long *)((long)pAVar8 + uVar39 * 0x3bf0 + 0x1e8);
    lVar32 = (long)(int)FVar13;
    lVar14 = (int)lVar16 * lVar32;
    if (0x10 < (int)((ulong)(lVar14 + (lVar14 >> 0x3f) + 0x8000) >> 0x10)) {
      lVar16 = FT_DivFix(0x10,FVar13);
    }
    for (; pAVar24 < local_48; pAVar24 = pAVar24 + 1) {
      uVar21 = 0xffff;
      local_58 = (AF_Edge_conflict)0x0;
      for (uVar26 = 0; uVar26 != hints->axis[uVar39].num_edges; uVar26 = uVar26 + 1) {
        pAVar15 = hints->axis[uVar39].edges;
        if (pAVar15[uVar26].dir == pAVar24->dir) {
          pAVar15 = pAVar15 + uVar26;
          uVar31 = (int)pAVar24->pos - (int)pAVar15->fpos;
          uVar37 = -uVar31;
          if (0 < (int)uVar31) {
            uVar37 = uVar31;
          }
          uVar33 = (ulong)uVar37 & 0xffff;
          if (uVar33 < uVar21 && (long)uVar33 < lVar16) {
            if (pAVar24->link != (AF_Segment)0x0) {
              lVar14 = 0;
              pAVar38 = pAVar15->first;
              do {
                if (pAVar38->link != (AF_Segment)0x0) {
                  sVar36 = pAVar24->link->pos;
                  sVar4 = pAVar38->link->pos;
                  iVar19 = (int)sVar4 - (int)sVar36;
                  if (sVar4 < sVar36) {
                    iVar19 = (int)sVar36 - (int)sVar4;
                  }
                  lVar14 = (long)iVar19;
                  if (lVar16 <= lVar14) break;
                }
                pAVar38 = pAVar38->edge_next;
              } while (pAVar38 != pAVar15->first);
              if (lVar16 <= lVar14) goto LAB_0022a21d;
            }
            uVar21 = uVar33;
            local_58 = pAVar15;
          }
        }
LAB_0022a21d:
      }
      if (local_58 == (AF_Edge_conflict)0x0) {
        FVar11 = af_axis_hints_new_edge
                           (axis_00,(int)pAVar24->pos,(int)pAVar24->dir,'\0',memory,&local_38);
        if (FVar11 != 0) {
          return FVar11;
        }
        local_38->link = (AF_Edge)0x0;
        local_38->serif = (AF_Edge)0x0;
        local_38->scale = 0;
        local_38->blue_edge = (AF_Width)0x0;
        *(undefined8 *)&local_38->score = 0;
        local_38->pos = 0;
        local_38->flags = '\0';
        local_38->dir = '\0';
        *(undefined6 *)&local_38->field_0x1a = 0;
        *(undefined8 *)local_38 = 0;
        local_38->opos = 0;
        local_38->first = pAVar24;
        local_38->last = pAVar24;
        local_38->dir = pAVar24->dir;
        sVar36 = pAVar24->pos;
        local_38->fpos = sVar36;
        lVar14 = sVar36 * lVar32;
        lVar14 = lVar14 + (lVar14 >> 0x3f) + 0x8000 >> 0x10;
        local_38->opos = lVar14;
        local_38->pos = lVar14;
        pAVar24->edge_next = pAVar24;
      }
      else {
        pAVar24->edge_next = local_58->first;
        local_58->last->edge_next = pAVar24;
        local_58->last = pAVar24;
      }
    }
    pAVar15 = hints->axis[uVar39].edges;
    pAVar22 = pAVar15;
    if (pAVar15 == (AF_Edge_conflict)0x0) {
      pAVar18 = (AF_Edge_conflict)0x0;
    }
    else {
      pAVar18 = pAVar15 + hints->axis[uVar39].num_edges;
    }
    for (; pAVar22 < pAVar18; pAVar22 = pAVar22 + 1) {
      pAVar38 = pAVar22->first;
      pAVar29 = pAVar38;
      if (pAVar38 != (AF_Segment)0x0) {
        do {
          pAVar29->edge = pAVar22;
          ppAVar1 = &pAVar29->edge_next;
          pAVar29 = *ppAVar1;
        } while (*ppAVar1 != pAVar38);
      }
    }
    for (; pAVar15 < pAVar18; pAVar15 = pAVar15 + 1) {
      pAVar38 = pAVar15->first;
      if (pAVar38 == (AF_Segment)0x0) {
        iVar19 = 0;
        iVar28 = 0;
      }
      else {
        iVar19 = 0;
        iVar28 = 0;
        pAVar29 = pAVar38;
        do {
          bVar25 = pAVar29->flags;
          pAVar23 = pAVar29->serif;
          if (pAVar23 == (AF_Segment)0x0) {
            pAVar10 = pAVar29->link;
            if (pAVar29->link != (AF_Segment)0x0) {
LAB_0022a379:
              pAVar23 = pAVar10;
              bVar9 = false;
              ppAVar44 = &pAVar15->link;
              goto LAB_0022a37e;
            }
          }
          else if ((pAVar29->link != (AF_Segment)0x0) || (pAVar23->edge != pAVar15)) {
            pAVar10 = pAVar29->link;
            if (pAVar23->edge == pAVar15) goto LAB_0022a379;
            bVar9 = true;
            ppAVar44 = &pAVar15->serif;
LAB_0022a37e:
            pAVar22 = *ppAVar44;
            if (pAVar22 == (AF_Edge_conflict)0x0) {
LAB_0022a3c5:
              pAVar22 = pAVar23->edge;
            }
            else {
              iVar43 = (int)pAVar15->fpos - (int)pAVar22->fpos;
              uVar30 = (ushort)iVar43;
              uVar27 = -uVar30;
              if (0 < iVar43) {
                uVar27 = uVar30;
              }
              sVar36 = pAVar29->pos;
              sVar4 = pAVar23->pos;
              iVar43 = (int)sVar4 - (int)sVar36;
              if (sVar4 < sVar36) {
                iVar43 = (int)sVar36 - (int)sVar4;
              }
              if (iVar43 < (int)(uint)uVar27) goto LAB_0022a3c5;
            }
            if (bVar9) {
              pAVar15->serif = pAVar22;
              pAVar22->flags = pAVar22->flags | 2;
            }
            else {
              pAVar15->link = pAVar22;
            }
          }
          uVar37 = bVar25 & 1;
          iVar19 = iVar19 + uVar37;
          iVar28 = iVar28 + (uint)(byte)((byte)uVar37 ^ 1);
          pAVar29 = pAVar29->edge_next;
        } while (pAVar29 != pAVar38);
      }
      pAVar15->flags = iVar28 <= iVar19 && 0 < iVar19;
      if ((pAVar15->serif != (AF_Edge)0x0) && (pAVar15->link != (AF_Edge)0x0)) {
        pAVar15->serif = (AF_Edge)0x0;
      }
    }
    FVar11 = 0;
  }
  return FVar11;
}

Assistant:

static FT_Error
  af_cjk_hints_detect_features( AF_GlyphHints  hints,
                                AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_cjk_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_cjk_hints_link_segments( hints, dim );

      error = af_cjk_hints_compute_edges( hints, dim );
    }
    return error;
  }